

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# none.hpp
# Opt level: O2

string * __thiscall
websocketpp::transport::asio::basic_socket::connection::get_remote_endpoint_abi_cxx11_
          (string *__return_storage_ptr__,connection *this,error_code *ec)

{
  error_category *peVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  error_category *in_RCX;
  error_code ec_00;
  error_code aec;
  endpoint ep;
  stringstream s;
  error_code local_1f0;
  string local_1e0 [36];
  endpoint_type local_1bc;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1f0.val_ = 0;
  local_1f0._4_4_ = local_1f0._4_4_ & 0xffffff00;
  local_1f0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint(&local_1bc,
                    &((this->m_socket).
                      super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    ,&local_1f0);
  if (local_1f0.failed_ == true) {
    peVar1 = error::get_category();
    ec->_M_value = 3;
    ec->_M_cat = peVar1;
    poVar2 = std::operator<<(local_190,"Error getting remote endpoint: ");
    ec_00.cat_ = in_RCX;
    ec_00._0_8_ = local_1f0.cat_;
    pbVar3 = boost::system::operator<<
                       ((system *)poVar2,
                        (basic_ostream<char,_std::char_traits<char>_> *)
                        CONCAT44(local_1f0._4_4_,local_1f0.val_),ec_00);
    poVar2 = std::operator<<(pbVar3," (");
    (*((error_category *)&(local_1f0.cat_)->_vptr_error_category)->_vptr_error_category[4])
              (local_1e0,local_1f0.cat_,(ulong)(uint)local_1f0.val_);
    poVar2 = std::operator<<(poVar2,local_1e0);
    std::operator<<(poVar2,")");
    std::__cxx11::string::~string(local_1e0);
  }
  else {
    peVar1 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar1;
    boost::asio::ip::operator<<(local_190,&local_1bc);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string get_remote_endpoint(lib::error_code & ec) const {
        std::stringstream s;

        lib::asio::error_code aec;
        lib::asio::ip::tcp::endpoint ep = m_socket->remote_endpoint(aec);

        if (aec) {
            ec = error::make_error_code(error::pass_through);
            s << "Error getting remote endpoint: " << aec
               << " (" << aec.message() << ")";
            return s.str();
        } else {
            ec = lib::error_code();
            s << ep;
            return s.str();
        }
    }